

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_surface.hpp
# Opt level: O3

void __thiscall
sisl::utility::isosurface::cache_vertex
          (isosurface *this,
          map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
          *vMap,int *vIndex,vertex3 *v1,vertex3 *v2,double *iVal1,double *iVal2,double *isoValue,
          double *ss,function *f,bool approximate_gradient)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  _Base_ptr p_Var6;
  double *pdVar7;
  undefined8 *puVar8;
  double *pdVar9;
  _Base_ptr p_Var10;
  double *pdVar11;
  Index index;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  vector local_c8;
  vertex3 local_b0;
  vector local_90;
  pair<const_int,_sisl::vertex3> local_80;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  p_Var6 = (vMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var1 = &(vMap->_M_t)._M_impl.super__Rb_tree_header;
    iVar2 = *vIndex;
    p_Var10 = &p_Var1->_M_header;
    do {
      if (iVar2 <= (int)p_Var6[1]._M_color) {
        p_Var10 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < iVar2];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var10 != p_Var1) && ((int)p_Var10[1]._M_color <= iVar2)) {
      return;
    }
  }
  uVar3 = (v1->p).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (((long)uVar3 < 0) ||
     (uVar13 = (v2->p).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows, (long)uVar13 < 0)) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (uVar3 != uVar13) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>]"
                 );
  }
  dVar14 = *iVal2 - *iVal1;
  uVar13 = -(ulong)(ABS(dVar14) < 0.0001);
  dVar14 = (double)(uVar13 & 0x3fe0000000000000 | ~uVar13 & (ulong)((*isoValue - *iVal1) / dVar14));
  dVar15 = 1.0 - dVar14;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if (uVar3 == 0) {
    pdVar9 = (v1->p).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
    ;
    pdVar11 = (v2->p).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    uVar13 = 0;
  }
  else {
    uStack_50 = 0;
    uStack_40 = 0;
    local_58 = dVar15;
    local_48 = dVar14;
    if (0x1fffffffffffffff < uVar3) {
LAB_00144532:
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = operator_delete;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pdVar7 = (double *)malloc(uVar3 * 8);
    if (uVar3 != 1 && ((ulong)pdVar7 & 0xf) != 0) goto LAB_00144513;
    if (pdVar7 == (double *)0x0) goto LAB_00144532;
    pdVar9 = (v1->p).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
    ;
    pdVar11 = (v2->p).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    uVar13 = uVar3 & 0x1ffffffffffffffe;
    dVar15 = local_58;
    dVar14 = local_48;
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar7;
    if (uVar3 != 1) {
      uVar12 = 0;
      do {
        dVar4 = (pdVar9 + uVar12)[1];
        dVar5 = (pdVar11 + uVar12)[1];
        pdVar7[uVar12] = pdVar11[uVar12] * local_48 + pdVar9[uVar12] * local_58;
        (pdVar7 + uVar12)[1] = dVar5 * local_48 + dVar4 * local_58;
        uVar12 = uVar12 + 2;
      } while (uVar12 < uVar13);
    }
  }
  if ((long)uVar13 < (long)uVar3) {
    do {
      local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar13] = pdVar11[uVar13] * dVar14 + pdVar9[uVar13] * dVar15;
      uVar13 = uVar13 + 1;
    } while (uVar3 != uVar13);
  }
  local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar3;
  local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)malloc(0x18);
  if (((ulong)local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data & 0xf) == 0) {
    if (local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
      vertex3::vertex3(&local_b0,&local_c8,&local_90);
      local_80.first = *vIndex;
      vertex3::vertex3(&local_80.second,&local_b0);
      std::
      _Rb_tree<int,std::pair<int_const,sisl::vertex3>,std::_Select1st<std::pair<int_const,sisl::vertex3>>,std::less<int>,std::allocator<std::pair<int_const,sisl::vertex3>>>
      ::_M_insert_unique<std::pair<int_const,sisl::vertex3>>
                ((_Rb_tree<int,std::pair<int_const,sisl::vertex3>,std::_Select1st<std::pair<int_const,sisl::vertex3>>,std::less<int>,std::allocator<std::pair<int_const,sisl::vertex3>>>
                  *)vMap,&local_80);
      free(local_80.second.n.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_80.second.p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_b0.n.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      free(local_b0.p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      free(local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      free(local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      return;
    }
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = operator_delete;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
LAB_00144513:
  __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                "void *Eigen::internal::aligned_malloc(std::size_t)");
}

Assistant:

inline void cache_vertex(
                    std::map<int, sisl::vertex3 > *vMap,
                    const int &vIndex,
                    const vertex3 &v1,
                    const vertex3 &v2,
                    const double &iVal1,
                    const double &iVal2,
                    const double &isoValue,
                    const double &ss,
                    sisl::function *f,
                    bool approximate_gradient = false) {

                #pragma omp critical(cache_vertex)
                {
                    if(vMap->find(vIndex) == vMap->end()) {
                        double interpolate = (isoValue -iVal1)/(iVal2-iVal1);
                        if(fabs(iVal2-iVal1) < 0.0001)
                            interpolate = 0.5;
                        sisl::vector vnew = v1.p*(1.-interpolate) + v2.p*(interpolate);
                        sisl::vector na(3);// = f->grad(vnew);

                        vMap->insert(
                            {
                                vIndex,
                                sisl::vertex3(vnew, na)
                            });
                    }
                }
            }